

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frequency.c
# Opt level: O0

int equal_frequency(frequency_t *a,frequency_t *b)

{
  int iVar1;
  bool local_19;
  frequency_t *b_local;
  frequency_t *a_local;
  
  iVar1 = strcmp(a->trip_id,b->trip_id);
  local_19 = false;
  if (iVar1 == 0) {
    iVar1 = strcmp(a->start_time,b->start_time);
    local_19 = false;
    if (iVar1 == 0) {
      iVar1 = strcmp(a->end_time,b->end_time);
      local_19 = false;
      if ((iVar1 == 0) && (local_19 = false, a->headway_secs == b->headway_secs)) {
        local_19 = a->exact_times == b->exact_times;
      }
    }
  }
  return (int)local_19;
}

Assistant:

int equal_frequency(const frequency_t *a, const frequency_t *b) {
    return (!strcmp(a->trip_id, b->trip_id) &&
             !strcmp(a->start_time, b->start_time) &&
             !strcmp(a->end_time, b->end_time) &&
             a->headway_secs == b->headway_secs &&
             a->exact_times == b->exact_times);
}